

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rasterizing.cpp
# Opt level: O3

void render(void)

{
  pointer pfVar1;
  Vec2f *pVVar2;
  int iVar3;
  pointer __s;
  pointer __s_00;
  pointer __s_01;
  pointer pfVar4;
  Vec3f *pVVar5;
  int k;
  long lVar6;
  int fi;
  long lVar7;
  pointer *ppvVar8;
  value_type_conflict1 *__val;
  float fVar10;
  undefined8 uVar9;
  float fVar11;
  float fVar12;
  undefined8 uVar13;
  float fVar15;
  Vec2f text [3];
  Vec3f pointsLeft [3];
  Vec3f norms [3];
  Vec3f pointsRight [3];
  Matrix ViewPort;
  Matrix TotalTransformRight;
  Matrix TotalTransformLeft;
  Matrix ProjectionRight;
  Matrix ProjectionLeft;
  Matrix ModelViewRight;
  Matrix ModelViewLeft;
  undefined1 local_368 [32];
  undefined1 local_348 [16];
  undefined1 local_338 [32];
  undefined4 local_318;
  pointer local_308;
  float local_300;
  pointer local_2f8;
  float local_2f0;
  string local_2e8;
  string local_2c8;
  string local_2a8;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> local_288;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> local_270;
  Matrix local_258;
  undefined4 local_238;
  Vec2f VStack_230;
  undefined1 local_228 [16];
  undefined8 local_218;
  undefined8 uStack_210;
  undefined4 local_208;
  vector<float,_std::allocator<float>_> local_1f8;
  vector<float,_std::allocator<float>_> local_1e0;
  vector<Vec3<float>,_std::allocator<Vec3<float>_>_> local_1c8;
  Matrix local_1b0;
  Matrix local_190;
  Matrix local_170;
  Matrix local_150;
  Matrix local_130;
  Matrix local_110;
  Matrix local_f0;
  Vec3f local_d0;
  Vec3f local_c0;
  Vec3f local_b0;
  Vec3f local_a0;
  Vec3f local_90;
  Vec3f local_80;
  Matrix local_70;
  Matrix local_50;
  float fVar14;
  
  TGAImage::read_tga_file(&texture,"../res/diablo3_pose_diffuse.tga");
  TGAImage::flip_vertically(&texture);
  __s = (pointer)operator_new(0x2400000);
  local_1c8.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = __s;
  memset(__s,0,0x2400000);
  local_1c8.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = __s + 0x300000;
  local_1c8.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s + 0x300000;
  __s_00 = (pointer)operator_new(0x2400000);
  local_270.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = __s_00;
  memset(__s_00,0,0x2400000);
  local_270.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = __s_00 + 0x300000;
  local_270.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s_00 + 0x300000;
  __s_01 = (pointer)operator_new(0x2400000);
  local_288.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_start = __s_01;
  memset(__s_01,0,0x2400000);
  local_288.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_finish = __s_01 + 0x300000;
  local_288.super__Vector_base<Vec3<float>,_std::allocator<Vec3<float>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = __s_01 + 0x300000;
  pfVar4 = (pointer)operator_new(0xc00000);
  lVar6 = 0;
  local_1e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = pfVar4;
  local_1e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pfVar4 + 0x300000;
  memset(pfVar4,0,0xc00000);
  do {
    pfVar1 = pfVar4 + lVar6;
    pfVar1[0] = -3.4028235e+38;
    pfVar1[1] = -3.4028235e+38;
    pfVar1[2] = -3.4028235e+38;
    pfVar1[3] = -3.4028235e+38;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x300000);
  local_368._24_8_ = pfVar4;
  local_1e0.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfVar4 + 0x300000;
  pfVar4 = (pointer)operator_new(0xc00000);
  lVar6 = 0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = pfVar4;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = pfVar4 + 0x300000;
  memset(pfVar4,0,0xc00000);
  do {
    pfVar1 = pfVar4 + lVar6;
    pfVar1[0] = -3.4028235e+38;
    pfVar1[1] = -3.4028235e+38;
    pfVar1[2] = -3.4028235e+38;
    pfVar1[3] = -3.4028235e+38;
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x300000);
  local_80.x = -0.1;
  local_80.y = 0.0;
  local_80.z = 2.5;
  local_90.z = 0.0;
  local_90.x = 0.0;
  local_90.y = 0.0;
  local_a0.x = 0.0;
  local_a0.y = 1.0;
  local_a0.z = 0.0;
  local_1f8.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = pfVar4 + 0x300000;
  lookat(&local_f0,&local_80,&local_90,&local_a0);
  local_b0.x = 0.1;
  local_b0.y = 0.0;
  local_b0.z = 2.5;
  local_c0.z = 0.0;
  local_c0.x = 0.0;
  local_c0.y = 0.0;
  local_d0.x = 0.0;
  local_d0.y = 1.0;
  local_d0.z = 0.0;
  lookat(&local_110,&local_b0,&local_c0,&local_d0);
  viewport(&local_1b0,0x100,0xc0,0x600,0x480);
  projection(&local_130,2.5019991);
  projection(&local_150,2.5019991);
  Matrix::operator*((Matrix *)local_338,&local_1b0,&local_130);
  Matrix::operator*(&local_170,(Matrix *)local_338,&local_f0);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)local_338);
  Matrix::operator*((Matrix *)local_338,&local_1b0,&local_150);
  Matrix::operator*(&local_190,(Matrix *)local_338,&local_110);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector((vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             *)local_338);
  fi = 0;
  local_318 = 0;
  local_338._16_8_ = (pointer)0x0;
  local_338._24_8_ = (pointer)0x0;
  local_338._0_8_ = (pointer)0x0;
  local_338._8_8_ = (pointer)0x0;
  local_208 = 0;
  local_218 = 0;
  uStack_210 = 0;
  local_228._0_4_ = 0.0;
  local_228._4_4_ = 0.0;
  local_228._8_8_ = 0;
  if (0 < (int)((ulong)((long)diablo.faces.
                              super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)diablo.faces.
                             super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 3) * -0x55555555) {
    do {
      lVar7 = 8;
      lVar6 = 0;
      do {
        iVar3 = Model::vert(&diablo,fi,(int)lVar6);
        pVVar5 = Model::point(&diablo,iVar3);
        local_2f8 = *(pointer *)pVVar5;
        local_2f0 = pVVar5->z;
        iVar3 = Model::vert(&diablo,fi,(int)lVar6);
        pVVar5 = Model::point(&diablo,iVar3);
        local_308 = *(pointer *)pVVar5;
        local_300 = pVVar5->z;
        v2m(&local_258,(Vec3f *)&local_2f8);
        Matrix::operator*(&local_50,&local_170,&local_258);
        m2v((Matrix *)local_368);
        ((Vec2f *)(local_348 + lVar7 + 8))->x = (float)local_368._0_4_;
        ((Vec2f *)(local_348 + lVar7 + 8))->y = (float)local_368._4_4_;
        *(undefined4 *)(local_338 + lVar7) = local_368._8_4_;
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_50.m);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_258.m);
        v2m(&local_258,(Vec3f *)&local_308);
        Matrix::operator*(&local_70,&local_190,&local_258);
        m2v((Matrix *)local_368);
        pVVar2 = (Vec2f *)((long)&VStack_230.x + lVar7);
        pVVar2->x = (float)local_368._0_4_;
        pVVar2->y = (float)local_368._4_4_;
        *(undefined4 *)(local_228 + lVar7) = local_368._8_4_;
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_70.m);
        std::
        vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        ::~vector(&local_258.m);
        lVar6 = lVar6 + 1;
        lVar7 = lVar7 + 0xc;
      } while (lVar6 != 3);
      local_258.m.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      local_258.rows = 0;
      local_258.cols = 0;
      local_258.m.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_258.m.
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_238 = 0;
      local_368._0_4_ = 0.0;
      local_368._4_4_ = 0.0;
      local_368._8_8_ = (pointer)0x0;
      local_368._16_8_ = (pointer)0x0;
      ppvVar8 = &local_258.m.
                 super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      lVar6 = 0;
      do {
        Model::normal((Model *)local_348,0x10b258,fi);
        ((_Vector_impl_data *)(ppvVar8 + -1))->_M_start = (pointer)local_348._0_8_;
        *(undefined4 *)ppvVar8 = local_348._8_4_;
        Model::uv((Model *)local_348,0x10b258,fi);
        *(undefined8 *)(local_368 + lVar6 * 8) = local_348._0_8_;
        lVar6 = lVar6 + 1;
        ppvVar8 = (pointer *)((long)ppvVar8 + 0xc);
      } while (lVar6 != 3);
      rasterizeTriangle((Vec3f *)local_338,(Vec3f *)&local_258,(Vec2f *)local_368,&local_270,
                        &local_1e0);
      rasterizeTriangle((Vec3f *)local_228,(Vec3f *)&local_258,(Vec2f *)local_368,&local_288,
                        &local_1f8);
      fi = fi + 1;
      iVar3 = (int)((ulong)((long)diablo.faces.
                                  super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                           (long)diablo.faces.
                                 super__Vector_base<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>,_std::allocator<std::vector<Vec3<int>,_std::allocator<Vec3<int>_>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start) >> 3);
    } while (SBORROW4(fi,iVar3 * -0x55555555) != fi + iVar3 * 0x55555555 < 0);
  }
  local_2a8._M_dataplus._M_p = (pointer)&local_2a8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2a8,"Left","");
  writeInFile(&local_270,0x800,0x600,&local_2a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
    operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
  }
  local_2c8._M_dataplus._M_p = (pointer)&local_2c8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2c8,"Right","");
  writeInFile(&local_288,0x800,0x600,&local_2c8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c8._M_dataplus._M_p != &local_2c8.field_2) {
    operator_delete(local_2c8._M_dataplus._M_p,local_2c8.field_2._M_allocated_capacity + 1);
  }
  lVar6 = 8;
  do {
    fVar11 = *(float *)((long)&__s_00->x + lVar6);
    uVar9 = *(undefined8 *)((long)__s_00 + lVar6 + -8);
    fVar15 = (float)uVar9;
    fVar10 = (float)((ulong)uVar9 >> 0x20);
    fVar12 = fVar11;
    if (fVar11 <= fVar10) {
      fVar12 = fVar10;
    }
    if (fVar12 <= fVar15) {
      fVar12 = fVar15;
    }
    if (1.0 < fVar12) {
      fVar12 = 1.0 / fVar12;
      fVar11 = fVar11 * fVar12;
      uVar9 = CONCAT44(fVar10 * fVar12,fVar15 * fVar12);
      *(undefined8 *)((long)__s_00 + lVar6 + -8) = uVar9;
      *(float *)((long)&__s_00->x + lVar6) = fVar11;
    }
    fVar12 = *(float *)((long)&__s_01->x + lVar6);
    uVar13 = *(undefined8 *)((long)__s_01 + lVar6 + -8);
    fVar10 = (float)uVar13;
    fVar14 = (float)((ulong)uVar13 >> 0x20);
    fVar15 = fVar12;
    if (fVar12 <= fVar14) {
      fVar15 = fVar14;
    }
    if (fVar15 <= fVar10) {
      fVar15 = fVar10;
    }
    if (1.0 < fVar15) {
      fVar15 = 1.0 / fVar15;
      fVar12 = fVar12 * fVar15;
      fVar14 = fVar14 * fVar15;
      uVar13 = CONCAT44(fVar14,fVar10 * fVar15);
      *(undefined8 *)((long)__s_01 + lVar6 + -8) = uVar13;
      *(float *)((long)&__s_01->x + lVar6) = fVar12;
    }
    *(ulong *)((long)__s + lVar6 + -8) =
         CONCAT44(((float)((ulong)uVar9 >> 0x20) + fVar14) * 0.5,((float)uVar9 + fVar11) * 0.5);
    *(float *)((long)&__s->x + lVar6) = (fVar12 + (float)uVar13) * 0.5;
    lVar6 = lVar6 + 0xc;
  } while (lVar6 != 0x2400008);
  local_2e8._M_dataplus._M_p = (pointer)&local_2e8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2e8,"17","");
  writeInFile(&local_1c8,0x800,0x600,&local_2e8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2e8._M_dataplus._M_p != &local_2e8.field_2) {
    operator_delete(local_2e8._M_dataplus._M_p,local_2e8.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_190.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_170.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_150.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_130.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_1b0.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_110.m);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_f0.m);
  operator_delete(pfVar4,0xc00000);
  operator_delete((void *)local_368._24_8_,0xc00000);
  operator_delete(__s_01,0x2400000);
  operator_delete(__s_00,0x2400000);
  operator_delete(__s,0x2400000);
  return;
}

Assistant:

void render(){
    //std::vector<float> zBuffer(width*height);
    //Vec3f camera = Vec3f(0, 0, 2); // camera.z used in the projection matrix, != 0

    texture.read_tga_file("../res/diablo3_pose_diffuse.tga"); // getting texture
    texture.flip_vertically();
    //std::fill(zBuffer.begin(), zBuffer.end(), std::numeric_limits<float>::lowest()); // filling z-buffer

    std::vector<Vec3f> framebuffer(width*height); //used for the fusion
    std::vector<Vec3f> framebufferLeftEye(width*height); //image used for left eye
    std::vector<Vec3f> framebufferRightEye(width*height);//image used for right eye

    //Matrix VP = viewport((float)width/8, (float)height/8, (float)width*3/4, (float)height*3/4); // getting viewport
    //Matrix P  = projection(camera.z);// getting perspective matrix


    std::vector<float> zBufferLeft(width*height);
    std::fill(zBufferLeft.begin(), zBufferLeft.end(), std::numeric_limits<float>::lowest());
    std::vector<float> zBufferRight(width*height);
    std::fill(zBufferRight.begin(), zBufferRight.end(), std::numeric_limits<float>::lowest());

    Vec3f center(0,0,0);

    Vec3f leftEye(-0.1, 0, 2.5);
    Vec3f rightEye(0.1, 0, 2.5);
    Matrix ModelViewLeft = lookat(leftEye, center, Vec3f(0,1,0));
    Matrix ModelViewRight = lookat(rightEye, center, Vec3f(0,1,0));
    Matrix ViewPort = viewport(width/8, height/8, width*3/4, height*3/4);

    Matrix ProjectionLeft = projection((leftEye - center).norm());
    Matrix ProjectionRight = projection((rightEye - center).norm());

    Matrix TotalTransformLeft = ViewPort * ProjectionLeft * ModelViewLeft;
    Matrix TotalTransformRight = ViewPort * ProjectionRight * ModelViewRight;


    // drawing things here
    Vec3f pointsLeft[nbPoints];
    Vec3f pointsRight[nbPoints];
    Vec3f pointLeft;
    Vec3f pointRight;

    #pragma omp parallel for
    for(int i = 0; i < diablo.nfaces(); i++){   // fetching diablo's mesh
        for(int j = 0; j < nbPoints; j++){
            pointLeft = diablo.point(diablo.vert(i, j));
            pointRight = diablo.point(diablo.vert(i, j));

            pointsLeft[j] = m2v(TotalTransformLeft * v2m(pointLeft));
            pointsRight[j] = m2v(TotalTransformRight * v2m(pointRight));
        }

        Vec3f norms[nbPoints];
        Vec2f text[nbPoints];
        // retrieving normal for each vertices, and textures position
        for(int k = 0 ; k < nbPoints; k++){
            norms[k] = diablo.normal(i, k);
            text[k] = diablo.uv(i, k);
        }
        rasterizeTriangle(pointsLeft, norms, text, framebufferLeftEye, zBufferLeft);
        rasterizeTriangle(pointsRight, norms, text, framebufferRightEye, zBufferRight);
    }

    // generating file
    writeInFile(framebufferLeftEye, width, height, "Left");
    writeInFile(framebufferRightEye, width, height, "Right");

    for (size_t i = 0; i < height * width; ++i) {
        Vec3f &c = framebufferLeftEye[i];
        Vec3f &cbis = framebufferRightEye[i];
        Vec3f res;
        float max = std::max(c[0], std::max(c[1], c[2]));
        if (max > 1) c = c * (1. / max);
        float maxbis = std::max(cbis[0], std::max(cbis[1], cbis[2]));
        if (maxbis > 1) cbis = cbis * (1. / maxbis);

        res = Vec3f((c.x + c.z) / 2., (c.y + cbis.y)/2., (cbis.x + cbis.z) / 2.);

        framebuffer[i] = res ;

    }


    writeInFile(framebuffer, width, height, "17");



}